

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void glcts::prepareDataForTexture<unsigned_char,1u>
               (Functions *gl,GLint cube_face,GLint element_index,GLint mipmap_level,
               GLenum texture_format,GLenum texture_type,GLsizei texture_width,
               GLsizei texture_height,uchar *components)

{
  GLenum err;
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  GLuint n_components_per_line;
  vector<unsigned_char,_std::allocator<unsigned_char>_> texture_data;
  
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&texture_data,(ulong)(uint)(texture_height * texture_width));
  if (0 < texture_height) {
    uVar1 = 0;
    iVar2 = 0;
    do {
      uVar4 = (ulong)(uint)texture_width;
      uVar3 = uVar1;
      if (0 < texture_width) {
        do {
          texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] = *components;
          uVar3 = uVar3 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      iVar2 = iVar2 + 1;
      uVar1 = uVar1 + texture_width;
    } while (iVar2 != texture_height);
  }
  (*gl->texSubImage3D)
            (0x9009,mipmap_level,0,0,cube_face + element_index * 6,texture_width,texture_height,1,
             texture_format,texture_type,
             texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (*gl->getError)();
  glu::checkError(err,"Failed to update texture data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x37b);
  if (texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(texture_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)texture_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texture_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void prepareDataForTexture(const glw::Functions& gl, glw::GLint cube_face, glw::GLint element_index,
						   glw::GLint mipmap_level, glw::GLenum texture_format, glw::GLenum texture_type,
						   glw::GLsizei texture_width, glw::GLsizei texture_height, const T* components)
{
	static const glw::GLuint n_components_per_pixel = N_Components;

	const glw::GLuint n_pixels			  = texture_width * texture_height;
	const glw::GLuint n_total_componenets = n_components_per_pixel * n_pixels;
	const glw::GLuint z_offset			  = element_index * 6 + cube_face;

	std::vector<T> texture_data;
	texture_data.resize(n_total_componenets);

	fillImage<T, N_Components>(texture_width, texture_height, components, &texture_data[0]);

	gl.texSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, mipmap_level, 0 /* x */, 0 /* y */, z_offset, texture_width,
					 texture_height, 1 /* depth */, texture_format, texture_type, &texture_data[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to update texture data");
}